

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::TryAllocDecommittedPages<true>
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment)

{
  size_t *psVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar5;
  code *pcVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_00;
  char *pcVar10;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar11;
  ulong uVar12;
  long lVar13;
  undefined4 *puVar14;
  undefined8 *in_FS_OFFSET;
  Iterator local_48;
  uint local_34;
  
  local_34 = pageCount;
  iVar9 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar9 == '\0') {
    puVar14 = (undefined4 *)*in_FS_OFFSET;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)*in_FS_OFFSET;
    *puVar14 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x45c,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar8) {
LAB_00263ec7:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar14 = 0;
  }
  local_48.list = &this->decommitSegments;
  local_48.current =
       &(local_48.list)->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  do {
    if ((DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
        local_48.current ==
        (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_00263ec7;
      *puVar14 = 0;
    }
    local_48.current =
         (((DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
          local_48.current)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
         .base;
    if ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
        local_48.current == local_48.list) {
      return (char *)0x0;
    }
    this_00 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
              ::Iterator::Data(&local_48);
    uVar2 = this_00->freePageCount;
    uVar3 = this_00->decommitPageCount;
    pcVar10 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::
              AllocDecommitPages<BVStatic<272ul>,true>
                        (this_00,local_34,(BVStatic<272UL>)*&(this_00->freePages).data,
                         (BVStatic<272UL>)*&(this_00->decommitPages).data);
    uVar7 = local_34;
    if (pcVar10 != (char *)0x0) {
      uVar4 = this_00->freePageCount;
      uVar12 = (this->freePageCount - (ulong)uVar2) + (ulong)uVar4;
      this->freePageCount = uVar12;
      this->decommitPageCount =
           (ulong)this_00->decommitPageCount + (this->decommitPageCount - (ulong)uVar3);
      if (uVar12 < this->debugMinFreePageCount) {
        this->debugMinFreePageCount = uVar12;
      }
      LogRecommitPages(this,(ulong)((local_34 - uVar2) + uVar4));
      lVar13 = (ulong)uVar7 * 0x1000;
      this->usedBytes = this->usedBytes + lVar13;
      LOCK();
      totalUsedBytes = totalUsedBytes + lVar13;
      UNLOCK();
      if (maxUsedBytes < totalUsedBytes) {
        maxUsedBytes = totalUsedBytes;
      }
      if (this->memoryData != (PageMemoryData *)0x0) {
        psVar1 = &this->memoryData->allocPageCount;
        *psVar1 = *psVar1 + (ulong)uVar7;
      }
      if (this_00->decommitPageCount == 0) {
        pDVar11 = GetSegmentList(this,this_00);
        pDVar5 = (((DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    *)&(local_48.current)->next)->next).base;
        (((((DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
           &(local_48.current)->next)->prev).base)->next).base = pDVar5;
        pDVar5->prev = ((DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                         *)&(local_48.current)->next)->prev;
        pDVar5 = (pDVar11->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 ).next.base;
        ((DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
        &(local_48.current)->next)->prev = pDVar5->prev;
        (((DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
         &(local_48.current)->next)->next).base = pDVar5;
        *(NodeBase **)pDVar5->prev = local_48.current;
        (pDVar5->prev).node =
             (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
             local_48.current;
        *(int *)&(((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                  &(local_48.list)->super_RealCount)->
                 super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator =
             *(int *)&(((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                       &(local_48.list)->super_RealCount)->
                      super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                      super_SegmentBaseCommon.allocator + -1;
        (pDVar11->super_RealCount).count = (pDVar11->super_RealCount).count + 1;
      }
      *pageSegment = this_00;
      return pcVar10;
    }
  } while( true );
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocDecommittedPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

    while (i.Next())
    {
        TPageSegment * freeSegment = &i.Data();
        uint oldFreePageCount = freeSegment->GetFreePageCount();
        uint oldDecommitPageCount = freeSegment->GetDecommitPageCount();

        char * pages = freeSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
            this->freePageCount = this->freePageCount - oldFreePageCount + freeSegment->GetFreePageCount();

#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount - oldDecommitPageCount + freeSegment->GetDecommitPageCount();
#endif
#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
            uint recommitPageCount = pageCount - (oldFreePageCount - freeSegment->GetFreePageCount());
            LogRecommitPages(recommitPageCount);
            LogAllocPages(pageCount);

            if (freeSegment->GetDecommitPageCount() == 0)
            {
                auto toList = GetSegmentList(freeSegment);
                i.MoveCurrentTo(toList);
            }

            *pageSegment = freeSegment;
            return pages;
        }
    }
    return nullptr;
}